

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

wchar_t __thiscall CharFieldSourceString::getch(CharFieldSourceString *this)

{
  wchar_t wVar1;
  
  if (this->len != 0) {
    wVar1 = utf8_ptr::getch(&this->p);
    utf8_ptr::inc(&this->p,&this->len);
    return wVar1;
  }
  return L'\0';
}

Assistant:

virtual wchar_t getch()
    {
        if (len != 0)
        {
            wchar_t ch = p.getch();
            p.inc(&len);
            return ch;
        }
        else
            return 0;
    }